

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::recoverboundary(tetgenmesh *this,clock_t *tv)

{
  char *pcVar1;
  point pdVar2;
  bool bVar3;
  int iVar4;
  tetgenbehavior *ptVar5;
  arraypool *misseglist;
  unsigned_long uVar6;
  long lVar7;
  shellface *pppdVar8;
  clock_t cVar9;
  arraypool *paVar10;
  arraypool *paVar11;
  long lVar12;
  int iVar13;
  tetgenmesh *ptVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  face *paryseg;
  long local_58;
  face *parysh;
  point *parypt;
  arraypool *local_40;
  clock_t *local_38;
  
  ptVar5 = this->b;
  local_38 = tv;
  if (ptVar5->quiet == 0) {
    puts("Recovering boundaries...");
    ptVar5 = this->b;
  }
  if (ptVar5->verbose != 0) {
    puts("  Recovering segments.");
  }
  this->checksubsegflag = 1;
  misseglist = (arraypool *)operator_new(0x30);
  misseglist->objectbytes = 0x10;
  misseglist->objectsperblock = 0x100;
  misseglist->log2objectsperblock = 8;
  misseglist->objectsperblockmark = 0xff;
  misseglist->toparraylen = 0;
  misseglist->toparray = (char **)0x0;
  misseglist->objects = 0;
  misseglist->totalmemory = 0;
  local_40 = (arraypool *)operator_new(0x30);
  local_40->objectbytes = 8;
  local_40->objectsperblock = 0x100;
  local_40->log2objectsperblock = 8;
  local_40->objectsperblockmark = 0xff;
  local_40->toparraylen = 0;
  local_40->toparray = (char **)0x0;
  local_40->objects = 0;
  local_40->totalmemory = 0;
  memorypool::traversalinit(this->subsegs);
  lVar16 = 0;
  while (lVar7 = this->subsegs->items, lVar16 < lVar7) {
    lVar16 = lVar16 + 1;
    uVar6 = randomnation(this,(uint)lVar16);
    ptVar14 = (tetgenmesh *)this->subsegstack;
    arraypool::newindex((arraypool *)ptVar14,&paryseg);
    paVar10 = this->subsegstack;
    uVar17 = (uint)uVar6;
    pcVar1 = paVar10->toparray[(int)uVar17 >> ((byte)paVar10->log2objectsperblock & 0x1f)];
    lVar7 = (long)paVar10->objectbytes * (long)(int)(paVar10->objectsperblockmark & uVar17);
    paryseg->sh = *(shellface **)(pcVar1 + lVar7);
    paryseg->shver = *(int *)(pcVar1 + lVar7 + 8);
    pppdVar8 = shellfacetraverse(ptVar14,this->subsegs);
    paVar10 = this->subsegstack;
    pcVar1 = paVar10->toparray[(int)uVar17 >> ((byte)paVar10->log2objectsperblock & 0x1f)];
    lVar7 = (long)paVar10->objectbytes * (long)(int)(uVar17 & paVar10->objectsperblockmark);
    paryseg = (face *)(pcVar1 + lVar7);
    *(shellface **)(pcVar1 + lVar7) = pppdVar8;
    pcVar1 = pcVar1 + lVar7 + 8;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
  }
  if (this->b->fliplinklevel < 0) {
    this->autofliplinklevel = 1;
  }
  iVar4 = 0;
  while( true ) {
    recoversegments(this,misseglist,0,0);
    lVar16 = misseglist->objects;
    ptVar5 = this->b;
    if ((lVar16 < 1) || (-1 < ptVar5->fliplinklevel)) break;
    if (lVar16 < lVar7) {
      local_58 = CONCAT44(local_58._4_4_,iVar4 - (uint)(0 < iVar4));
      lVar7 = lVar16;
    }
    else {
      local_58 = CONCAT44(local_58._4_4_,iVar4 + 1);
      if (1 < iVar4) {
        ptVar5->fliplinklevel = 100000;
      }
    }
    for (lVar15 = 0; lVar15 < lVar16; lVar15 = lVar15 + 1) {
      arraypool::newindex(this->subsegstack,&paryseg);
      pcVar1 = misseglist->toparray[(uint)lVar15 >> ((byte)misseglist->log2objectsperblock & 0x1f)];
      lVar16 = (long)misseglist->objectbytes *
               (long)(int)(misseglist->objectsperblockmark & (uint)lVar15);
      paryseg->sh = *(shellface **)(pcVar1 + lVar16);
      paryseg->shver = *(int *)(pcVar1 + lVar16 + 8);
      lVar16 = misseglist->objects;
    }
    misseglist->objects = 0;
    this->autofliplinklevel = this->autofliplinklevel + this->b->fliplinklevelinc;
    iVar4 = (int)local_58;
  }
  if (ptVar5->verbose != 0) {
    printf("  %ld (%ld) segments are recovered (missing).\n",this->subsegs->items - lVar16,lVar16);
    lVar16 = misseglist->objects;
  }
  if (0 < lVar16) {
    do {
      lVar7 = lVar16;
      if (lVar16 < 1) break;
      for (lVar15 = 0; lVar15 < lVar7; lVar15 = lVar15 + 1) {
        arraypool::newindex(this->subsegstack,&paryseg);
        pcVar1 = misseglist->toparray
                 [(uint)lVar15 >> ((byte)misseglist->log2objectsperblock & 0x1f)];
        lVar7 = (long)misseglist->objectbytes *
                (long)(int)(misseglist->objectsperblockmark & (uint)lVar15);
        paryseg->sh = *(shellface **)(pcVar1 + lVar7);
        paryseg->shver = *(int *)(pcVar1 + lVar7 + 8);
        lVar7 = misseglist->objects;
      }
      misseglist->objects = 0;
      recoversegments(this,misseglist,1,0);
      lVar7 = misseglist->objects;
      bVar3 = lVar7 < lVar16;
      lVar16 = lVar7;
    } while (bVar3);
    if (this->b->verbose != 0) {
      printf("  %ld (%ld) segments are recovered (missing).\n",this->subsegs->items - lVar7,lVar7);
      lVar7 = misseglist->objects;
    }
    if (0 < lVar7) {
      do {
        lVar16 = lVar7;
        if (lVar7 < 1) break;
        for (lVar15 = 0; lVar15 < lVar16; lVar15 = lVar15 + 1) {
          arraypool::newindex(this->subsegstack,&paryseg);
          pcVar1 = misseglist->toparray
                   [(uint)lVar15 >> ((byte)misseglist->log2objectsperblock & 0x1f)];
          lVar16 = (long)misseglist->objectbytes *
                   (long)(int)(misseglist->objectsperblockmark & (uint)lVar15);
          paryseg->sh = *(shellface **)(pcVar1 + lVar16);
          paryseg->shver = *(int *)(pcVar1 + lVar16 + 8);
          lVar16 = misseglist->objects;
        }
        misseglist->objects = 0;
        recoversegments(this,misseglist,1,1);
        lVar16 = misseglist->objects;
        bVar3 = lVar16 < lVar7;
        lVar7 = lVar16;
      } while (bVar3);
      if (this->b->verbose != 0) {
        printf("  Added %ld Steiner points in volume.\n",this->st_volref_count);
        lVar16 = misseglist->objects;
      }
      if (0 < lVar16) {
        lVar7 = this->st_volref_count;
        for (lVar15 = 0; lVar15 < lVar16; lVar15 = lVar15 + 1) {
          arraypool::newindex(this->subsegstack,&paryseg);
          pcVar1 = misseglist->toparray
                   [(uint)lVar15 >> ((byte)misseglist->log2objectsperblock & 0x1f)];
          lVar16 = (long)misseglist->objectbytes *
                   (long)(int)(misseglist->objectsperblockmark & (uint)lVar15);
          paryseg->sh = *(shellface **)(pcVar1 + lVar16);
          paryseg->shver = *(int *)(pcVar1 + lVar16 + 8);
          lVar16 = misseglist->objects;
        }
        misseglist->objects = 0;
        recoversegments(this,misseglist,1,2);
        if ((this->b->verbose != 0) &&
           (printf("  Added %ld Steiner points in segments.\n",this->st_segref_count),
           lVar7 < this->st_volref_count)) {
          printf("  Added another %ld Steiner points in volume.\n");
        }
      }
    }
  }
  lVar16 = this->st_segref_count;
  if (0 < lVar16) {
    local_58 = this->st_volref_count;
    for (lVar7 = 0; lVar15 = local_58, paVar10 = this->subvertstack, lVar7 < paVar10->objects;
        lVar7 = lVar7 + 1) {
      lVar15 = (long)paVar10->objectbytes * (long)(int)(paVar10->objectsperblockmark & (uint)lVar7);
      parypt = (point *)(paVar10->toparray
                         [(uint)lVar7 >> ((byte)paVar10->log2objectsperblock & 0x1f)] + lVar15);
      pdVar2 = *(point *)(paVar10->toparray
                          [(uint)lVar7 >> ((byte)paVar10->log2objectsperblock & 0x1f)] + lVar15);
      iVar4 = removevertexbyflips(this,pdVar2);
      if (iVar4 == 0) {
        arraypool::newindex(local_40,&parypt);
        *parypt = pdVar2;
      }
    }
    lVar7 = this->st_segref_count;
    if (lVar7 < lVar16 && this->b->verbose != 0) {
      lVar12 = this->st_volref_count;
      if (local_58 < lVar12) {
        printf("  Suppressed %ld Steiner points in segments.\n");
        lVar7 = this->st_segref_count;
        lVar12 = this->st_volref_count;
      }
      lVar7 = (lVar12 - lVar15) + lVar7;
      lVar15 = lVar16 - lVar7;
      if (lVar15 != 0 && lVar7 <= lVar16) {
        printf("  Removed %ld Steiner points in segments.\n",lVar15);
      }
    }
    this->subvertstack->objects = 0;
  }
  cVar9 = clock();
  *local_38 = cVar9;
  if (this->b->verbose != 0) {
    puts("  Recovering facets.");
  }
  this->checksubfaceflag = 1;
  paVar10 = (arraypool *)operator_new(0x30);
  paVar10->objectbytes = 0x10;
  paVar10->objectsperblock = 0x100;
  paVar10->log2objectsperblock = 8;
  paVar10->objectsperblockmark = 0xff;
  paVar10->toparraylen = 0;
  paVar10->toparray = (char **)0x0;
  paVar10->objects = 0;
  paVar10->totalmemory = 0;
  memorypool::traversalinit(this->subfaces);
  lVar16 = 0;
  while (lVar7 = this->subfaces->items, lVar16 < lVar7) {
    lVar16 = lVar16 + 1;
    uVar6 = randomnation(this,(uint)lVar16);
    ptVar14 = (tetgenmesh *)this->subfacstack;
    arraypool::newindex((arraypool *)ptVar14,&parysh);
    paVar11 = this->subfacstack;
    uVar17 = (uint)uVar6;
    pcVar1 = paVar11->toparray[(int)uVar17 >> ((byte)paVar11->log2objectsperblock & 0x1f)];
    lVar7 = (long)paVar11->objectbytes * (long)(int)(paVar11->objectsperblockmark & uVar17);
    parysh->sh = *(shellface **)(pcVar1 + lVar7);
    parysh->shver = *(int *)(pcVar1 + lVar7 + 8);
    pppdVar8 = shellfacetraverse(ptVar14,this->subfaces);
    paVar11 = this->subfacstack;
    pcVar1 = paVar11->toparray[(int)uVar17 >> ((byte)paVar11->log2objectsperblock & 0x1f)];
    lVar7 = (long)paVar11->objectbytes * (long)(int)(uVar17 & paVar11->objectsperblockmark);
    parysh = (face *)(pcVar1 + lVar7);
    *(shellface **)(pcVar1 + lVar7) = pppdVar8;
    pcVar1 = pcVar1 + lVar7 + 8;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
  }
  this->b->fliplinklevel = -1;
  iVar4 = 1;
  iVar13 = 0;
  while( true ) {
    this->autofliplinklevel = iVar4;
    recoversubfaces(this,paVar10,0);
    lVar16 = paVar10->objects;
    ptVar5 = this->b;
    if ((lVar16 < 1) || (-1 < ptVar5->fliplinklevel)) break;
    if (lVar16 < lVar7) {
      local_58 = CONCAT44(local_58._4_4_,iVar13 - (uint)(0 < iVar13));
      lVar7 = lVar16;
    }
    else {
      local_58 = CONCAT44(local_58._4_4_,iVar13 + 1);
      if (1 < iVar13) {
        ptVar5->fliplinklevel = 100000;
      }
    }
    for (lVar15 = 0; lVar15 < lVar16; lVar15 = lVar15 + 1) {
      arraypool::newindex(this->subfacstack,&parysh);
      pcVar1 = paVar10->toparray[(uint)lVar15 >> ((byte)paVar10->log2objectsperblock & 0x1f)];
      lVar16 = (long)paVar10->objectbytes * (long)(int)(paVar10->objectsperblockmark & (uint)lVar15)
      ;
      parysh->sh = *(shellface **)(pcVar1 + lVar16);
      parysh->shver = *(int *)(pcVar1 + lVar16 + 8);
      lVar16 = paVar10->objects;
    }
    paVar10->objects = 0;
    iVar4 = this->autofliplinklevel + this->b->fliplinklevelinc;
    iVar13 = (int)local_58;
  }
  if (ptVar5->verbose != 0) {
    printf("  %ld (%ld) subfaces are recovered (missing).\n");
    lVar16 = paVar10->objects;
  }
  if (0 < lVar16) {
    for (lVar7 = 0; lVar7 < lVar16; lVar7 = lVar7 + 1) {
      arraypool::newindex(this->subfacstack,&parysh);
      pcVar1 = paVar10->toparray[(uint)lVar7 >> ((byte)paVar10->log2objectsperblock & 0x1f)];
      lVar16 = (long)paVar10->objectbytes * (long)(int)(paVar10->objectsperblockmark & (uint)lVar7);
      parysh->sh = *(shellface **)(pcVar1 + lVar16);
      parysh->shver = *(int *)(pcVar1 + lVar16 + 8);
      lVar16 = paVar10->objects;
    }
    paVar10->objects = 0;
    recoversubfaces(this,(arraypool *)0x0,1);
    if (this->b->verbose != 0) {
      printf("  Added %ld Steiner points in facets.\n",this->st_facref_count);
    }
  }
  if (0 < this->st_facref_count) {
    local_58 = this->st_facref_count;
    for (lVar16 = 0; paVar11 = this->subvertstack, lVar16 < paVar11->objects; lVar16 = lVar16 + 1) {
      lVar7 = (long)paVar11->objectbytes * (long)(int)(paVar11->objectsperblockmark & (uint)lVar16);
      parypt = (point *)(paVar11->toparray
                         [(uint)lVar16 >> ((byte)paVar11->log2objectsperblock & 0x1f)] + lVar7);
      pdVar2 = *(point *)(paVar11->toparray
                          [(uint)lVar16 >> ((byte)paVar11->log2objectsperblock & 0x1f)] + lVar7);
      iVar4 = removevertexbyflips(this,pdVar2);
      if (iVar4 == 0) {
        arraypool::newindex(local_40,&parypt);
        *parypt = pdVar2;
      }
    }
    if ((this->b->verbose != 0) && (this->st_facref_count < local_58)) {
      printf("  Removed %ld Steiner points in facets.\n");
      paVar11 = this->subvertstack;
    }
    paVar11->objects = 0;
  }
  if ((0 < local_40->objects) && (this->b->verbose != 0)) {
    printf("  %ld Steiner points remained in boundary.\n");
  }
  paVar11 = local_40;
  this->totalworkmemory =
       this->totalworkmemory +
       paVar10->totalmemory + misseglist->totalmemory + local_40->totalmemory;
  arraypool::~arraypool(local_40);
  operator_delete(paVar11,0x30);
  arraypool::~arraypool(misseglist);
  operator_delete(misseglist,0x30);
  arraypool::~arraypool(paVar10);
  operator_delete(paVar10,0x30);
  return;
}

Assistant:

void tetgenmesh::recoverboundary(clock_t& tv)
{
  arraypool *misseglist, *misshlist;
  arraypool *bdrysteinerptlist;
  face searchsh, *parysh;
  face searchseg, *paryseg;
  point rempt, *parypt;
  long ms; // The number of missing segments/subfaces.
  int nit; // The number of iterations.
  int s, i;

  // Counters.
  long bak_segref_count, bak_facref_count, bak_volref_count;

  if (!b->quiet) {
    printf("Recovering boundaries...\n");
  }


  if (b->verbose) {
    printf("  Recovering segments.\n");
  }

  // Segments will be introduced.
  checksubsegflag = 1;

  misseglist = new arraypool(sizeof(face), 8);
  bdrysteinerptlist = new arraypool(sizeof(point), 8);

  // In random order.
  subsegs->traversalinit();
  for (i = 0; i < subsegs->items; i++) {
    s = randomnation(i + 1);
    // Move the s-th seg to the i-th.
    subsegstack->newindex((void **) &paryseg);
    *paryseg = * (face *) fastlookup(subsegstack, s);
    // Put i-th seg to be the s-th.
    searchseg.sh = shellfacetraverse(subsegs);
    paryseg = (face *) fastlookup(subsegstack, s);
    *paryseg = searchseg;
  }

  // The init number of missing segments.
  ms = subsegs->items;
  nit = 0; 
  if (b->fliplinklevel < 0) {
    autofliplinklevel = 1; // Init value.
  }

  // First, trying to recover segments by only doing flips.
  while (1) {
    recoversegments(misseglist, 0, 0);

    if (misseglist->objects > 0) {
      if (b->fliplinklevel >= 0) {
        break;
      } else {
        if (misseglist->objects >= ms) {
          nit++;
          if (nit >= 3) {
            //break;
            // Do the last round with unbounded flip link level.
            b->fliplinklevel = 100000;
          }
        } else {
          ms = misseglist->objects;
          if (nit > 0) {
            nit--;
          }
        }
        for (i = 0; i < misseglist->objects; i++) {
          subsegstack->newindex((void **) &paryseg);
          *paryseg = * (face *) fastlookup(misseglist, i);
        }
        misseglist->restart();
        autofliplinklevel+=b->fliplinklevelinc;
      }
    } else {
      // All segments are recovered.
      break;
    }
  } // while (1)

  if (b->verbose) {
    printf("  %ld (%ld) segments are recovered (missing).\n", 
           subsegs->items - misseglist->objects, misseglist->objects);
  }

  if (misseglist->objects > 0) {
    // Second, trying to recover segments by doing more flips (fullsearch).
    while (misseglist->objects > 0) {
      ms = misseglist->objects;
      for (i = 0; i < misseglist->objects; i++) {
        subsegstack->newindex((void **) &paryseg);
        *paryseg = * (face *) fastlookup(misseglist, i);
      }
      misseglist->restart();

      recoversegments(misseglist, 1, 0);

      if (misseglist->objects < ms) {
        // The number of missing segments is reduced.
        continue;
      } else {
        break;
      }
    }
    if (b->verbose) {
      printf("  %ld (%ld) segments are recovered (missing).\n", 
             subsegs->items - misseglist->objects, misseglist->objects);
    }
  }

  if (misseglist->objects > 0) {
    // Third, trying to recover segments by doing more flips (fullsearch)
    //   and adding Steiner points in the volume.
    while (misseglist->objects > 0) {
      ms = misseglist->objects;
      for (i = 0; i < misseglist->objects; i++) {
        subsegstack->newindex((void **) &paryseg);
        *paryseg = * (face *) fastlookup(misseglist, i);
      }
      misseglist->restart();

      recoversegments(misseglist, 1, 1);

      if (misseglist->objects < ms) {
        // The number of missing segments is reduced.
        continue;
      } else {
        break;
      }
    }
    if (b->verbose) {
      printf("  Added %ld Steiner points in volume.\n", st_volref_count);
    }
  }

  if (misseglist->objects > 0) {
    // Last, trying to recover segments by doing more flips (fullsearch),
    //   and adding Steiner points in the volume, and splitting segments.
    long bak_inpoly_count = st_volref_count; //st_inpoly_count;
    for (i = 0; i < misseglist->objects; i++) {
      subsegstack->newindex((void **) &paryseg);
      *paryseg = * (face *) fastlookup(misseglist, i);
    }
    misseglist->restart();

    recoversegments(misseglist, 1, 2);

    if (b->verbose) {
      printf("  Added %ld Steiner points in segments.\n", st_segref_count);
      if (st_volref_count > bak_inpoly_count) {
        printf("  Added another %ld Steiner points in volume.\n", 
               st_volref_count - bak_inpoly_count);
      }
    }
  }


  if (st_segref_count > 0) {
    // Try to remove the Steiner points added in segments.
    bak_segref_count = st_segref_count;
    bak_volref_count = st_volref_count;
    for (i = 0; i < subvertstack->objects; i++) {
      // Get the Steiner point.
      parypt = (point *) fastlookup(subvertstack, i);
      rempt = *parypt;
      if (!removevertexbyflips(rempt)) {
        // Save it in list.
        bdrysteinerptlist->newindex((void **) &parypt);
        *parypt = rempt;
      }
    }
    if (b->verbose) {
      if (st_segref_count < bak_segref_count) {
        if (bak_volref_count < st_volref_count) {
          printf("  Suppressed %ld Steiner points in segments.\n", 
                 st_volref_count - bak_volref_count);
        }
        if ((st_segref_count + (st_volref_count - bak_volref_count)) <
            bak_segref_count) {
          printf("  Removed %ld Steiner points in segments.\n", 
                 bak_segref_count - 
                   (st_segref_count + (st_volref_count - bak_volref_count)));
        }
      }
    }
    subvertstack->restart();
  }


  tv = clock();

  if (b->verbose) {
    printf("  Recovering facets.\n");
  }

  // Subfaces will be introduced.
  checksubfaceflag = 1;

  misshlist = new arraypool(sizeof(face), 8);

  // Randomly order the subfaces.
  subfaces->traversalinit();
  for (i = 0; i < subfaces->items; i++) {
    s = randomnation(i + 1);
    // Move the s-th subface to the i-th.
    subfacstack->newindex((void **) &parysh);
    *parysh = * (face *) fastlookup(subfacstack, s);
    // Put i-th subface to be the s-th.
    searchsh.sh = shellfacetraverse(subfaces);
    parysh = (face *) fastlookup(subfacstack, s);
    *parysh = searchsh;
  }

  ms = subfaces->items;
  nit = 0; 
  b->fliplinklevel = -1; // Init.
  if (b->fliplinklevel < 0) {
    autofliplinklevel = 1; // Init value.
  }

  while (1) {
    recoversubfaces(misshlist, 0);

    if (misshlist->objects > 0) {
      if (b->fliplinklevel >= 0) {
        break;
      } else {
        if (misshlist->objects >= ms) {
          nit++;
          if (nit >= 3) {
            //break;
            // Do the last round with unbounded flip link level.
            b->fliplinklevel = 100000;
          }
        } else {
          ms = misshlist->objects;
          if (nit > 0) {
            nit--;
          }
        }
        for (i = 0; i < misshlist->objects; i++) {
          subfacstack->newindex((void **) &parysh);
          *parysh = * (face *) fastlookup(misshlist, i);
        }
        misshlist->restart();
        autofliplinklevel+=b->fliplinklevelinc;
      }
    } else {
      // All subfaces are recovered.
      break;
    }
  } // while (1)

  if (b->verbose) {
    printf("  %ld (%ld) subfaces are recovered (missing).\n", 
           subfaces->items - misshlist->objects, misshlist->objects);
  }

  if (misshlist->objects > 0) {
    // There are missing subfaces. Add Steiner points.
    for (i = 0; i < misshlist->objects; i++) {
      subfacstack->newindex((void **) &parysh);
      *parysh = * (face *) fastlookup(misshlist, i);
    }
    misshlist->restart();

    recoversubfaces(NULL, 1);

    if (b->verbose) {
      printf("  Added %ld Steiner points in facets.\n", st_facref_count);
    }
  }


  if (st_facref_count > 0) {
    // Try to remove the Steiner points added in facets.
    bak_facref_count = st_facref_count;
    for (i = 0; i < subvertstack->objects; i++) {
      // Get the Steiner point.
      parypt = (point *) fastlookup(subvertstack, i);
      rempt = *parypt;
      if (!removevertexbyflips(*parypt)) {
        // Save it in list.
        bdrysteinerptlist->newindex((void **) &parypt);
        *parypt = rempt;
      }
    }
    if (b->verbose) {
      if (st_facref_count < bak_facref_count) {
        printf("  Removed %ld Steiner points in facets.\n", 
               bak_facref_count - st_facref_count);
      }
    }
    subvertstack->restart();
  }


  if (bdrysteinerptlist->objects > 0) {
    if (b->verbose) {
      printf("  %ld Steiner points remained in boundary.\n",
             bdrysteinerptlist->objects);
    }
  } // if


  // Accumulate the dynamic memory.
  totalworkmemory += (misseglist->totalmemory + misshlist->totalmemory +
                      bdrysteinerptlist->totalmemory);

  delete bdrysteinerptlist;
  delete misseglist;
  delete misshlist;
}